

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_RemoveInitBias(void)

{
  Abc_Obj_t *pObj;
  undefined8 *puVar1;
  int i;
  
  for (i = 0; i < pManMR->vInitConstraints->nSize; i = i + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(pManMR->vInitConstraints,i);
    pObj = (Abc_Obj_t *)*puVar1;
    *puVar1 = 0;
    if (pObj != (Abc_Obj_t *)0x0) {
      Abc_NtkDeleteObj(pObj);
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_RemoveInitBias( ) {
  // Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode;
  InitConstraint_t *pConstraint;
  int i;

  Vec_PtrForEachEntry( InitConstraint_t *, pManMR->vInitConstraints, pConstraint, i ) {
    pBiasNode = pConstraint->pBiasNode;
    pConstraint->pBiasNode = NULL;

    if (pBiasNode)
      Abc_NtkDeleteObj(pBiasNode);
  }
}